

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.hpp
# Opt level: O0

span_t * lattice::extent(size_t L1,size_t L2)

{
  Scalar *pSVar1;
  Index in_RDX;
  Scalar in_RSI;
  Matrix<long,__1,__1,_0,__1,__1> *in_RDI;
  span_t *span;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb0;
  
  Eigen::Matrix<long,-1,-1,0,-1,-1>::Matrix<int,int>(in_RDI,(int *)in_RDI,in_stack_ffffffffffffffb0)
  ;
  Eigen::DenseBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffffa0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x109b7b);
  *pSVar1 = in_RSI;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_ffffffffffffffa0,in_RDX,0x109baa);
  *pSVar1 = in_RDX;
  return in_RDI;
}

Assistant:

inline span_t extent(std::size_t L1, std::size_t L2) {
  span_t span(2, 2); span.setZero();
  span(0, 0) = L1;
  span(1, 1) = L2;
  return span;
}